

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O3

void duckdb::CurrentDatabaseFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  ClientContext *pCVar1;
  long *plVar2;
  Value val;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  Value local_58 [64];
  
  pCVar1 = (ClientContext *)duckdb::ExpressionState::GetContext();
  plVar2 = (long *)duckdb::DatabaseManager::GetDefaultDatabase_abi_cxx11_(pCVar1);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,*plVar2,plVar2[1] + *plVar2);
  duckdb::Value::Value(local_58,local_78);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  duckdb::Vector::Reference((Value *)result);
  duckdb::Value::~Value(local_58);
  return;
}

Assistant:

static void CurrentDatabaseFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	Value val(DatabaseManager::GetDefaultDatabase(state.GetContext()));
	result.Reference(val);
}